

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedSSOSimple::Run(AdvancedSSOSimple *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  GLuint GVar4;
  reference data;
  Vector<float,_4> *map_data_00;
  int iVar5;
  int local_d8;
  Vector<float,_4> local_a0;
  Vector<float,_4> *local_90;
  vec4 *map_data;
  undefined1 local_80 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_b;
  int minor;
  int wsy;
  int wsx;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_cs;
  AdvancedSSOSimple *pAStack_18;
  int kSize;
  AdvancedSSOSimple *this_local;
  
  pAStack_18 = this;
  bVar1 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,0,2);
  if (bVar1) {
    glsl_cs._4_4_ = 4;
    if ((this->pipeline & 1U) != 0) {
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline[0],1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline[0],2,this->m_fsp0);
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline[1],1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline[1],2,this->m_fsp1);
    }
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,this->m_texture);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,0x2800,0x2600);
    iVar2 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
    iVar3 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
    glu::CallLogWrapper::glTexStorage3D
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c1a,1,0x8814,iVar2,iVar3,8);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_texture,0,'\0',6,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,this->m_texture,0,'\0',4,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,this->m_texture,0,'\0',1,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,3,this->m_texture,0,'\0',3,0x88ba,0x8814);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao);
    if ((this->pipeline & 1U) == 0) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[0]);
    }
    else {
      glu::CallLogWrapper::glBindProgramPipeline
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline[0]);
    }
    glu::CallLogWrapper::glDrawArraysInstanced
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4,1);
    if ((this->pipeline & 1U) == 0) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[1]);
    }
    else {
      glu::CallLogWrapper::glBindProgramPipeline
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_pipeline[1]);
    }
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4);
    local_28 = 
    "\n#define KSIZE 4\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 0) readonly uniform image2D g_image[4];\nlayout(std430) buffer OutputBuffer {\n  uvec4 counter;\n  vec4 data[];\n};\nvoid main() {\n  uint idx = atomicAdd(counter[0], 1u);\n  data[idx][0] = (imageLoad(g_image[0], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][1] = (imageLoad(g_image[1], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][2] = (imageLoad(g_image[2], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][3] = (imageLoad(g_image[3], ivec2(gl_GlobalInvocationID))).z;\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\n#define KSIZE 4\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 0) readonly uniform image2D g_image[4];\nlayout(std430) buffer OutputBuffer {\n  uvec4 counter;\n  vec4 data[];\n};\nvoid main() {\n  uint idx = atomicAdd(counter[0], 1u);\n  data[idx][0] = (imageLoad(g_image[0], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][1] = (imageLoad(g_image[1], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][2] = (imageLoad(g_image[2], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][3] = (imageLoad(g_image[3], ivec2(gl_GlobalInvocationID))).z;\n}"
               ,&local_49);
    GVar4 = ShaderImageLoadStoreBase::CreateComputeProgram
                      (&this->super_ShaderImageLoadStoreBase,&local_48,false);
    this->c_program = GVar4;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->c_program);
    iVar2 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
    iVar2 = (iVar2 / 4) * 4;
    iVar3 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
    data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (iVar3 / 4) * 4;
    local_d8 = iVar2;
    if (data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < iVar2) {
      local_d8 = data_b.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_d8;
    iVar3 = iVar2 * data_b.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80,
               (long)(iVar3 + 1),(allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_buffer);
    iVar3 = iVar2 * data_b.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    data = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_80,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,(long)(iVar3 * 0x10 + 0x10),data,0x88e4);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x20);
    iVar3 = iVar2;
    if (iVar2 < 0) {
      iVar3 = iVar2 + 3;
    }
    iVar5 = data_b.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    if (data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
      iVar5 = data_b.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 3;
    }
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,iVar3 >> 2,iVar5 >> 2,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    map_data_00 = (Vector<float,_4> *)
                  glu::CallLogWrapper::glMapBufferRange
                            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,0x90d2,0x10,
                             (long)(iVar2 * data_b.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                                   * 0x10),1);
    iVar2 = (int)data_b.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_90 = map_data_00;
    tcu::Vector<float,_4>::Vector(&local_a0,10.0,11.0,100.0,101.0);
    bVar1 = glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            CompareValues<tcu::Vector<float,4>>
                      ((ShaderImageLoadStoreBase *)this,map_data_00,iVar2,&local_a0,0,1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = (AdvancedSSOSimple *)0x0;
    }
    else {
      this_local = (AdvancedSSOSimple *)&DAT_ffffffffffffffff;
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80);
  }
  else {
    this_local = (AdvancedSSOSimple *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 2))
			return NOT_SUPPORTED;
		const int kSize = 4;

		if (pipeline)
		{
			glUseProgramStages(m_pipeline[0], GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_pipeline[0], GL_FRAGMENT_SHADER_BIT, m_fsp0);
			glUseProgramStages(m_pipeline[1], GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_pipeline[1], GL_FRAGMENT_SHADER_BIT, m_fsp1);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 8);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 6, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 4, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(2, m_texture, 0, GL_FALSE, 1, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(3, m_texture, 0, GL_FALSE, 3, GL_READ_WRITE, GL_RGBA32F);

		glBindVertexArray(m_vao);
		if (pipeline)
			glBindProgramPipeline(m_pipeline[0]);
		else
			glUseProgram(m_program[0]);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		if (pipeline)
			glBindProgramPipeline(m_pipeline[1]);
		else
			glUseProgram(m_program[1]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		const char* const glsl_cs =
			NL "#define KSIZE 4" NL "layout (local_size_x = KSIZE, local_size_y = KSIZE) in;" NL
			   "layout(rgba32f, binding = 0) readonly uniform image2D g_image[4];" NL
			   "layout(std430) buffer OutputBuffer {" NL "  uvec4 counter;" NL "  vec4 data[];" NL "};" NL
			   "void main() {" NL "  uint idx = atomicAdd(counter[0], 1u);" NL
			   "  data[idx][0] = (imageLoad(g_image[0], ivec2(gl_GlobalInvocationID))).z;" NL
			   "  data[idx][1] = (imageLoad(g_image[1], ivec2(gl_GlobalInvocationID))).z;" NL
			   "  data[idx][2] = (imageLoad(g_image[2], ivec2(gl_GlobalInvocationID))).z;" NL
			   "  data[idx][3] = (imageLoad(g_image[3], ivec2(gl_GlobalInvocationID))).z;" NL "}";
		c_program = CreateComputeProgram(glsl_cs);
		glUseProgram(c_program);
		int wsx   = (getWindowWidth() / kSize) * kSize;
		int wsy   = (getWindowHeight() / kSize) * kSize;
		int minor = wsx > wsy ? wsy : wsx;

		std::vector<vec4> data_b(wsx * wsy + 1);
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (wsx * wsy + 1) * 4 * 4, &data_b[0], GL_STATIC_DRAW);

		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(wsx / kSize, wsy / kSize, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* map_data = (vec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 4 * 4, wsx * wsy * 4 * 4, GL_MAP_READ_BIT);

		if (!CompareValues(map_data, minor, vec4(10, 11, 100, 101)))
			return ERROR;
		return NO_ERROR;
	}